

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O1

Array_Data_Symbol * __thiscall
R10_Decoder::Indecoding_phase_1
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  uint32_t *__k;
  map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
  *this_00;
  pointer puVar1;
  void *pvVar2;
  bool bVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  uint uVar5;
  ulong uVar6;
  reference puVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  pointer puVar11;
  uint32_t r;
  uint32_t uVar12;
  uint uVar13;
  pointer pvVar14;
  Inter_Symbol_Generator *pIVar15;
  int i;
  uint32_t uVar16;
  size_type sVar17;
  _Base_ptr i_00;
  pointer pVVar18;
  ulong uVar19;
  R10_Decoder *this_01;
  long lVar20;
  Array_Data_Symbol *pAVar21;
  Row_Edge chosenRow;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonZeros_pos;
  ulong local_1e8;
  uint32_t local_1e0;
  uint32_t local_1dc;
  ulong local_1d8;
  Array_Data_Symbol *local_1d0;
  uint *local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1a0;
  undefined1 local_198 [24];
  uint32_t uStack_180;
  uint32_t uStack_17c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> local_160 [2];
  undefined8 uStack_12c;
  Array_Data_Symbol *local_120;
  Array_Data_Symbol *local_118;
  ulong local_110;
  Utility *local_108;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *local_100;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  local_e0 [8];
  ulong local_d8;
  void *local_d0;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  local_b0 [8];
  ulong local_a8;
  void *local_a0;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  Array_Data_Symbol *local_80;
  _Base_ptr local_78;
  Array_Data_Symbol *local_70;
  _Base_ptr local_68;
  matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_60;
  matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_40;
  
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  local_1a8 = &this->c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(local_1a8,(ulong)D->L);
  local_1a0 = &this->d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(local_1a0,(ulong)*M);
  uVar6 = (ulong)D->L;
  if (D->L != 0) {
    puVar11 = (local_1a8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar1 = (local_1a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = 0;
    do {
      puVar11[uVar19] = (uint)uVar19;
      puVar1[uVar19] = (uint)uVar19;
      uVar19 = uVar19 + 1;
      uVar6 = (ulong)D->L;
    } while (uVar19 < uVar6);
  }
  if ((uint)uVar6 < *M) {
    puVar11 = (local_1a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start + (int)(uint)uVar6;
    do {
      *puVar11 = (uint)uVar6;
      uVar5 = (uint)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      puVar11 = puVar11 + 1;
    } while (uVar5 < *M);
  }
  this->A_i = 0;
  this->A_u = 0;
  local_1d0 = D;
  local_1c8 = M;
  if (*M != 0) {
    pIVar15 = (Inter_Symbol_Generator *)0x0;
    do {
      local_198._0_8_ = A;
      local_198._8_8_ = pIVar15;
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::
      vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_98,
                 (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)local_198);
      uVar16 = local_1d0->L;
      sVar17 = 0;
      uVar12 = 0;
      do {
        puVar7 = boost::numeric::ublas::
                 unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&local_98,sVar17);
        uVar12 = uVar12 + (*puVar7 == '\x01');
        sVar17 = sVar17 + 1;
      } while ((uint)sVar17 <= uVar16 - 1);
      if ((pointer)local_98.size_ != (pointer)0x0) {
        operator_delete(local_98.data_,local_98.size_);
      }
      local_198._0_4_ = (uint32_t)pIVar15;
      pmVar8 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](&this->rows,(key_type *)local_198);
      pmVar8->position = (uint32_t)pIVar15;
      pmVar8->nonZeros = uVar12;
      pmVar8->originalDegree = uVar12;
      pIVar15 = (Inter_Symbol_Generator *)((long)&pIVar15->G_LDPC + 1);
    } while (pIVar15 < (Inter_Symbol_Generator *)(ulong)*local_1c8);
  }
  uVar16 = this->A_i;
  uVar12 = local_1d0->L;
  pAVar21 = local_1d0;
  if (this->A_u + uVar16 != uVar12) {
    __k = &this->A_i;
    this_00 = &this->rows;
    local_100 = &A->data_;
    local_108 = &this->util;
    local_120 = (Array_Data_Symbol *)A;
    do {
      uVar6 = (ulong)(uVar12 + 1);
      uVar19 = (ulong)(int)uVar16;
      bVar3 = true;
      if (uVar19 < (this->rows)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        bVar3 = true;
        local_1dc = 0x100001;
        do {
          local_1d8 = uVar19;
          local_198._0_4_ = uVar16;
          pmVar8 = std::
                   map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                   ::operator[](this_00,(key_type *)local_198);
          if (pmVar8->nonZeros != 0) {
            bVar3 = false;
          }
          local_198._0_4_ = uVar16;
          pmVar8 = std::
                   map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                   ::operator[](this_00,(key_type *)local_198);
          if (pmVar8->nonZeros == 2) {
            local_198._0_4_ = uVar16;
            pmVar8 = std::
                     map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                     ::operator[](this_00,(key_type *)local_198);
            local_1e0 = pmVar8->originalDegree;
            local_1e8._0_4_ = pmVar8->position;
            local_1e8._4_4_ = pmVar8->nonZeros;
            uVar6 = local_1e8 >> 0x20;
            A = (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_120;
            break;
          }
          local_198._0_4_ = uVar16;
          pmVar8 = std::
                   map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                   ::operator[](this_00,(key_type *)local_198);
          A = (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)local_120;
          if (pmVar8->nonZeros < (uint)uVar6) {
            local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = uVar16;
            pmVar8 = std::
                     map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                     ::operator[](this_00,(key_type *)&local_1c0);
            if (pmVar8->nonZeros == 0) goto LAB_0010c6dd;
            local_198._0_4_ = uVar16;
            pmVar8 = std::
                     map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                     ::operator[](this_00,(key_type *)local_198);
            local_1e0 = pmVar8->originalDegree;
            local_1e8._0_4_ = pmVar8->position;
            local_1e8._4_4_ = pmVar8->nonZeros;
            uVar6 = local_1e8 >> 0x20;
            local_1dc = local_1e0;
          }
          else {
LAB_0010c6dd:
            local_198._0_4_ = uVar16;
            pmVar8 = std::
                     map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                     ::operator[](this_00,(key_type *)local_198);
            if ((pmVar8->nonZeros == (uint)uVar6) &&
               (local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = uVar16,
               pmVar8 = std::
                        map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                        ::operator[](this_00,(key_type *)&local_1c0),
               pmVar8->originalDegree < local_1dc)) {
              pmVar8 = std::
                       map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                       ::operator[](this_00,(key_type *)local_198);
              local_1e0 = pmVar8->originalDegree;
              local_1e8._0_4_ = pmVar8->position;
              local_1e8._4_4_ = pmVar8->nonZeros;
              local_1dc = local_1e0;
            }
          }
          uVar19 = local_1d8 + 1;
          uVar16 = uVar16 + 1;
        } while (uVar19 < (this->rows)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      pAVar21 = local_1d0;
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Decoding Failure - PI Decoding  Phase 1: All entries in V are zero.",0x43);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        exit(-1);
      }
      local_198._8_8_ = ZEXT48(*__k);
      local_1d8 = uVar6;
      if ((uint)local_1e8 != *__k) {
        local_198._0_8_ = A;
        local_40.data_.e_ = A;
        local_40.i_ = local_1e8 & 0xffffffff;
        boost::numeric::ublas::
        matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::swap((matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_198,&local_40);
        puVar11 = (local_1a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar5 = puVar11[*__k];
        puVar11[*__k] = puVar11[local_1e8 & 0xffffffff];
        puVar11[local_1e8 & 0xffffffff] = uVar5;
        pmVar8 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](this_00,__k);
        pmVar9 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](this_00,(key_type *)&local_1e8);
        uVar16 = pmVar8->originalDegree;
        local_198._8_4_ = uVar16;
        local_198._0_8_ = *(undefined8 *)pmVar8;
        pmVar8->originalDegree = pmVar9->originalDegree;
        uVar12 = pmVar9->nonZeros;
        pmVar8->position = pmVar9->position;
        pmVar8->nonZeros = uVar12;
        pmVar9->originalDegree = uVar16;
        *(undefined8 *)pmVar9 = local_198._0_8_;
        uVar16 = (uint)local_1e8;
        pmVar8 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](this_00,(key_type *)&local_1e8);
        pmVar8->position = uVar16;
        uVar16 = *__k;
        pmVar8 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](this_00,__k);
        pmVar8->position = uVar16;
      }
      local_198._8_8_ = ZEXT48(*__k);
      this_01 = (R10_Decoder *)local_198;
      local_198._0_8_ = A;
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::
      vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                (local_b0,(vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)local_198);
      find_nonZeros_pos_In_Row
                (&local_1c0,this_01,
                 (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_b0,this->A_i,~this->A_u + pAVar21->L);
      if (local_a8 != 0) {
        operator_delete(local_a0,local_a8);
      }
      pvVar14 = (pointer)(ulong)*(uint *)CONCAT44(local_1c0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint32_t)
                                                  local_1c0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
      if (*__k != *(uint *)CONCAT44(local_1c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint32_t)
                                    local_1c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start)) {
        local_198._0_8_ = A;
        local_198._8_8_ = (Inter_Symbol_Generator *)(ulong)*__k;
        local_50.data_.e_ = A;
        local_50.j_ = (size_type)pvVar14;
        boost::numeric::ublas::
        matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::swap((matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_198,&local_50);
        puVar11 = (local_1a8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar5 = puVar11[*__k];
        puVar11[*__k] = puVar11[(long)pvVar14];
        puVar11[(long)pvVar14] = uVar5;
      }
      uVar5 = (int)((ulong)((long)local_1c0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           CONCAT44(local_1c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint32_t)
                                    local_1c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start)) >> 2) - 1;
      if (0 < (int)uVar5) {
        uVar13 = ~this->A_u + local_1d0->L;
        lVar20 = (ulong)uVar5 + 1;
        do {
          uVar5 = *(uint *)(CONCAT44(local_1c0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint32_t)
                                     local_1c0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) + -4 + lVar20 * 4);
          pIVar15 = (Inter_Symbol_Generator *)(ulong)uVar5;
          if (uVar13 != uVar5) {
            uVar6 = (ulong)uVar13;
            local_198._0_8_ = A;
            local_198._8_8_ = pIVar15;
            local_60.data_.e_ = A;
            local_60.j_ = uVar6;
            boost::numeric::ublas::
            matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::swap((matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_198,&local_60);
            puVar11 = (local_1a8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            uVar5 = puVar11[(long)pIVar15];
            puVar11[(long)pIVar15] = puVar11[uVar6];
            puVar11[uVar6] = uVar5;
          }
          uVar13 = uVar13 - 1;
          lVar20 = lVar20 + -1;
        } while (1 < lVar20);
      }
      pAVar21 = local_1d0;
      uVar5 = *__k + 1;
      if (uVar5 < *local_1c8) {
        do {
          i_00 = (_Base_ptr)(long)(int)uVar5;
          sVar10._0_4_ = ((Array_Data_Symbol *)A)->sym_len;
          sVar10._4_4_ = ((Array_Data_Symbol *)A)->X;
          sVar10 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                             ((size_type)i_00,sVar10,(ulong)*__k,
                              *(size_type *)&((Array_Data_Symbol *)A)->S);
          puVar7 = boost::numeric::ublas::
                   unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (local_100,sVar10);
          if (*puVar7 != '\0') {
            local_110 = (ulong)*__k;
            local_118 = (Array_Data_Symbol *)A;
            boost::numeric::ublas::
            vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
            ::
            vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_c8,
                       (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&local_118);
            local_70 = (Array_Data_Symbol *)A;
            local_68 = i_00;
            boost::numeric::ublas::
            vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
            ::
            vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                      (local_e0,(vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 *)&local_70);
            Utility::matrix_row_XOR
                      ((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_198,local_108,&local_c8,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_e0);
            local_80 = (Array_Data_Symbol *)A;
            local_78 = i_00;
            boost::numeric::ublas::
            matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
            ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                         *)&local_80,
                        (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)local_198);
            if ((Inter_Symbol_Generator *)local_198._8_8_ != (Inter_Symbol_Generator *)0x0) {
              operator_delete((void *)local_198._16_8_,local_198._8_8_);
            }
            if (local_d8 != 0) {
              operator_delete(local_d0,local_d8);
            }
            if (local_c8.data_.size_ != 0) {
              operator_delete(local_c8.data_.data_,local_c8.data_.size_);
            }
            pvVar4 = local_1a0;
            puVar11 = (local_1a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pVVar18 = (pAVar21->symbol).
                      super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
                      super__Vector_impl_data._M_start;
            Vector_Data_DEF::operator^
                      ((Vector_Data_DEF *)local_198,pVVar18 + puVar11[(long)i_00],
                       pVVar18 + puVar11[*__k]);
            pVVar18 = (pAVar21->symbol).
                      super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[(long)i_00];
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&pVVar18->s,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_198);
            pVVar18->d_len = uStack_180;
            Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)local_198);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < *local_1c8);
      }
      uVar16 = this->A_i + 1;
      this->A_i = uVar16;
      this->A_u = (this->A_u + (int)local_1d8) - 1;
      pIVar15 = (Inter_Symbol_Generator *)(long)(int)uVar16;
      if (pIVar15 < (Inter_Symbol_Generator *)
                    (this->rows)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        do {
          local_198._0_8_ = A;
          local_198._8_8_ = pIVar15;
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::
          vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_f8,
                     (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)local_198);
          sVar17 = (size_type)(int)this->A_i;
          uVar5 = ~this->A_u + pAVar21->L;
          uVar16 = 0;
          if (this->A_i <= uVar5) {
            uVar16 = 0;
            do {
              puVar7 = boost::numeric::ublas::
                       unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (&local_f8,sVar17);
              uVar16 = uVar16 + (*puVar7 == '\x01');
              sVar17 = sVar17 + 1;
            } while ((uint)sVar17 <= uVar5);
          }
          local_118 = (Array_Data_Symbol *)CONCAT44(local_118._4_4_,(int)pIVar15);
          pmVar8 = std::
                   map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                   ::operator[](this_00,(key_type *)&local_118);
          pmVar8->nonZeros = uVar16;
          if ((pointer)local_f8.size_ != (pointer)0x0) {
            operator_delete(local_f8.data_,local_f8.size_);
          }
          pIVar15 = (Inter_Symbol_Generator *)((long)&pIVar15->G_LDPC + 1);
          pAVar21 = local_1d0;
        } while (pIVar15 < (Inter_Symbol_Generator *)
                           (this->rows)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      pvVar2 = (void *)CONCAT44(local_1c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint32_t)
                                local_1c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_1c0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      uVar16 = this->A_i;
      uVar12 = pAVar21->L;
    } while (this->A_u + uVar16 != uVar12);
  }
  Indecoding_phase_2((Array_Data_Symbol *)local_198,this,A,pAVar21,local_1c8);
  __return_storage_ptr__->HP = local_198._16_4_;
  __return_storage_ptr__->L = local_198._20_4_;
  __return_storage_ptr__->LP = uStack_180;
  __return_storage_ptr__->K = uStack_17c;
  __return_storage_ptr__->sym_len = local_198._0_4_;
  __return_storage_ptr__->X = local_198._4_4_;
  __return_storage_ptr__->S = local_198._8_4_;
  __return_storage_ptr__->H = local_198._12_4_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&__return_storage_ptr__->ESIs,&local_178);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator=
            (&__return_storage_ptr__->symbol,local_160);
  *(undefined8 *)&__return_storage_ptr__->_HP = stack0xfffffffffffffecc;
  *(undefined8 *)&__return_storage_ptr__->_LP = uStack_12c;
  *(undefined8 *)&__return_storage_ptr__->_K =
       local_160[1].super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
       super__Vector_impl_data._4_8_;
  *(undefined8 *)&__return_storage_ptr__->_S =
       local_160[1].super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
       super__Vector_impl_data._12_8_;
  Array_Data_Symbol::~Array_Data_Symbol((Array_Data_Symbol *)local_198);
  return __return_storage_ptr__;
}

Assistant:

class Array_Data_Symbol R10_Decoder::Indecoding_phase_1(matrix<uint8_t> &A, class Array_Data_Symbol &D, uint32_t &M)
{

	uint32_t r = 0;


	class Array_Data_Symbol result;

	//printf("D.L : %d\n", D.L);

	c.resize(D.L);
	d.resize(M);

	for (int i = 0; i < D.L; i++)
	{
		c[i] = i;
		d[i] = i;
	}

	for (int i = D.L; i < M; i++)
	{
		d[i] = i;
	}

	A_i = 0;
	A_u = 0;




	//std::cout << "nonZeros: " << std::endl;
	for (int i = 0; i < M; i++)
	{
		class Row_Edge tmp;
		tmp.nonZeros = nonZeros_In_Row(row(A, i), 0, D.L - 1);
		tmp.originalDegree = tmp.nonZeros;
		tmp.position = i;		
		rows[i] = tmp;

		//printf("%d ", rows[i].nonZeros);
	}
//	std::cout << std::endl;



    // counts how many rows have been chosen already
    //uint32_t chosenRowsCounter = 0;

/*
	Let r be the minimum integer such that at least one row of A has exactly r ones in V.

      *  If r != 2, then choose a row with exactly r ones in V with
         minimum original degree among all such rows.

      *  If r = 2, then choose any row with exactly 2 ones in V that is
         part of a maximum size component in the graph defined by V.
*/

    while((A_i + A_u) !=  D.L)
    {

    	class Row_Edge chosenRow;
		bool allZeros = true;
		uint32_t minDegree = 1048576 + 1;

    	r = D.L + 1;




    	for (int i = A_i; i < rows.size() ; i++)
    	{
    		if (rows[i].nonZeros != 0)
    		{
    			allZeros = false;
    		}


    		if (rows[i].nonZeros == 2)
    		{
    			chosenRow = rows[i];
    			r = chosenRow.nonZeros;
    			minDegree = chosenRow.originalDegree;

    		//	printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    			break;
    		}


    		if ((rows[i].nonZeros < r) && (rows[i].nonZeros > 0) )
    		{
    			chosenRow = rows[i];
    			r = chosenRow.nonZeros;
    			minDegree = chosenRow.originalDegree;
    			    	//		printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    		}
    		else if ((rows[i].nonZeros == r) && rows[i].originalDegree < minDegree)
    		{
    			chosenRow = rows[i];
    			minDegree = chosenRow.originalDegree;
    			    //			printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    		}
    	}

    	// there need to recode. I just do it for the testing version!!
    	if (allZeros == true)
    	{
    		std::cout << "Decoding Failure - PI Decoding  Phase 1: All entries in V are zero." << std::endl;
    		exit(-1);
    	}

//    	printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

/*
	After the row is chosen in this step the first row of A that intersects V is exchanged with the chosen row so that the chosen row is the first row that intersects V.  

*/

		if (chosenRow.position != A_i)
			{

				//swap rows of A
				row(A, A_i).swap(row(A, chosenRow.position));

				//swap symbol in d according to A operation
				std::swap(d[A_i], d[chosenRow.position]);

				// update rows map
				// printf(" size of rows : %d pos: %d deg: %d\n", rows.size(), rows[A_i].position, rows[A_i].originalDegree);
				std::swap(rows[A_i], rows[chosenRow.position]);

				rows[chosenRow.position].position = chosenRow.position;

				rows[A_i].position = A_i;

				// printf(" size of rows : %d  pos: %d deg: %d\n", rows.size(), rows[chosenRow.position].position, rows[chosenRow.position].originalDegree);
	
			}	

	//	matrix_print(A);	



	/*
 	The columns of A among those that intersect V are reordered so that one of the r ones in the chosen row appears in the first column of V and so that the remaining r-1 ones appear in the last columns of V.
	*/
 		//caculate the  non-zeros bits position in A_i row of A
 		std::vector<uint32_t> nonZeros_pos = find_nonZeros_pos_In_Row(ublas::row(A, A_i), A_i, D.L - 1 - A_u);

 		// std::cout << "nonZeros position: " << std::endl;
 		// for (int i = 0; i < nonZeros_pos.size(); i++)
 		// {
 		// 	printf("%d ", nonZeros_pos[i]);
 		// }

 	//	std::cout << std::endl << std::endl;

 		uint32_t _1st_nonZeros_pos = nonZeros_pos[0];

 		if (A_i != _1st_nonZeros_pos)
 		{
 			ublas::column(A, A_i).swap(ublas::column(A, _1st_nonZeros_pos));

 			std::swap(c[A_i], c[_1st_nonZeros_pos]);
	 	
	 	}

	 // 	std::cout << "find_nonZeros_pos_In_Row A swap: " << std::endl;
		
		// for (int i = 0; i < c.size(); ++i)
		// {
		// 	printf("%d ", c[i]);
		// }

		// std::cout << std::endl;

		// matrix_print(A);	


		// swap the remaining non-zeros columns so that they are r-1 ones appear in the last columns of V
		uint32_t last_col = D.L - A_u - 1;
		for (int i = (nonZeros_pos.size() - 1); i > 0 ; i--)
		{
			// we need to know if the current column is the last column of V.
			uint32_t current_col = nonZeros_pos[i];
			if (current_col != last_col)
			{
				//if no, swap the current columns
				ublas::column(A, current_col).swap(ublas::column(A, last_col));

				std::swap(c[current_col], c[last_col]);

			}
			// move the last column of V
			last_col--;
		}
	 // 	std::cout << "remaining non-zeros of V swap: " << std::endl;
		
		// for (int i = 0; i < c.size(); ++i)
		// {
		// 	printf("%d ", c[i]);
		// }

		// std::cout << std::endl;

		// matrix_print(A);	





	/*
	Then, the chosen row is exclusive-ORed into all the other rows of A below the chosen row that have a one in the first column of V. 
	*/

		for (int _row = A_i + 1; _row < M; _row++)
		{
			//check if the A_ith column if '0'
			if (A(_row, A_i) == 0)
			{
				continue;
			}

			// using chosen rows XOR with remaining in A
			ublas::row(A, _row) = util.matrix_row_XOR(ublas::row(A, A_i), ublas::row(A, _row));
			// decoding process XOR D[d[row]] and D[d[i]]
	//		printf("symbol size: %d  row: %d  A_i: %d \n",D.symbol.size(), _row, A_i);


				D.symbol[d[_row]] = D.symbol[d[_row]] ^ D.symbol[d[A_i]];

			// for (int i = 0; i < D.sym_len; ++i)
			// {
			// 	D.symbol[_row].s[i] = D.symbol[_row].s[i] ^ D.symbol[A_i].s[i];
			// }

		}

	 //  	std::cout << "A XOR :  A_u: " <<  A_u << " A_i: "<<  A_i << std::endl;

		// matrix_print(A);	

	/*
	Finally, i is incremented by 1 and u is incremented by r-1, which completes the step.
	*/

    	A_i++;
 	   	A_u += r - 1;

	//  	std::cout << "A_u: " << A_u << " A_i: "<<  A_i << std::endl; 	   	

 	   	// update non-zeros
 	   	// std::cout << "position: " << std::endl;
 	   	// for (int i = 0; i < rows.size(); ++i)
 	   	// {
 	   	// 	printf("%d ", rows[i].position);
 	   	// }
 	   	// std::cout << std::endl;


	//	std::cout << "updated nonZeros: " << std::endl;
		for (int i = A_i; i < rows.size(); i++)
		{
			//uint32_t nzpos = rows[i].position;
			rows[i].nonZeros = nonZeros_In_Row(row(A, i), A_i, D.L - A_u - 1);
			//printf("%d:%d ",rows[i].position, rows[i].nonZeros);
		}
		//std::cout << std::endl;


    }



	result = Indecoding_phase_2(A, D, M);

    return result;

}